

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O3

void asio::detail::executor_function::
     complete<asio::detail::binder1<std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::_Placeholder<1>))(std::error_code_const&)>,std::error_code>,std::allocator<void>>
               (impl_base *base,bool call)

{
  _func_void_impl_base_ptr_bool *p_Var1;
  _func_void_impl_base_ptr_bool *p_Var2;
  impl_base *piVar3;
  _func_void_impl_base_ptr_bool *p_Var4;
  allocator<void> allocator;
  binder1<std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>))(const_std::error_code_&)>,_std::error_code>
  function;
  ptr p;
  allocator<void> local_61;
  _func_void_impl_base_ptr_bool *local_60;
  _func_void_impl_base_ptr_bool *local_58;
  _func_void_impl_base_ptr_bool *local_50;
  _func_void_impl_base_ptr_bool *local_48;
  _func_void_impl_base_ptr_bool *p_Stack_40;
  ptr local_38;
  
  local_38.a = &local_61;
  p_Var4 = base[1].complete_;
  p_Var1 = base[2].complete_;
  p_Var2 = base[3].complete_;
  local_48 = base[4].complete_;
  p_Stack_40 = base[5].complete_;
  local_60 = p_Var4;
  local_58 = p_Var1;
  local_50 = p_Var2;
  local_38.v = base;
  local_38.p = (impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>))(const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
                *)base;
  impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>))(const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_38);
  if (call) {
    piVar3 = (impl_base *)(p_Var2 + (long)p_Var1);
    if (((ulong)p_Var4 & 1) != 0) {
      p_Var4 = *(_func_void_impl_base_ptr_bool **)(p_Var4 + (long)(piVar3->complete_ + -1));
    }
    (*p_Var4)(piVar3,SUB81(&local_48,0));
  }
  impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>))(const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_38);
  return;
}

Assistant:

static void complete(impl_base* base, bool call)
  {
    // Take ownership of the function object.
    impl<Function, Alloc>* i(static_cast<impl<Function, Alloc>*>(base));
    Alloc allocator(i->allocator_);
    typename impl<Function, Alloc>::ptr p = {
      detail::addressof(allocator), i, i };

    // Make a copy of the function so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the function may be the true owner of the memory
    // associated with the function. Consequently, a local copy of the function
    // is required to ensure that any owning sub-object remains valid until
    // after we have deallocated the memory here.
    Function function(ASIO_MOVE_CAST(Function)(i->function_));
    p.reset();

    // Make the upcall if required.
    if (call)
    {
      asio_handler_invoke_helpers::invoke(function, function);
    }
  }